

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::setEnabled_helper(QWidgetPrivate *this,bool enable)

{
  QWidget *this_00;
  long lVar1;
  char cVar2;
  bool bVar3;
  QWidgetData *pQVar4;
  QWidget *pQVar5;
  undefined8 uVar6;
  int i;
  ulong uVar7;
  undefined7 in_register_00000031;
  WidgetAttribute attribute;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if ((((((int)CONCAT71(in_register_00000031,enable) != 0) &&
        (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) &&
       (lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar1 != 0)) &&
      ((*(byte *)(*(long *)(lVar1 + 0x20) + 8) & 1) != 0)) ||
     ((((byte)this_00->data->widget_attributes ^ enable) & 1) != 0)) goto LAB_002f59a7;
  QWidget::setAttribute(this_00,WA_Disabled,!enable);
  if (enable) {
    attribute = WA_ForceDisabled;
  }
  else {
    pQVar5 = QWidget::window(this_00);
    attribute = WA_Disabled;
    if ((*(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x90) == this_00) &&
       (((lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar1 != 0 &&
         ((*(byte *)(*(long *)(lVar1 + 0x20) + 8) & 1) != 0)) ||
        (cVar2 = (**(code **)(*(long *)this_00 + 0x198))(this_00), cVar2 == '\0')))) {
      QWidget::clearFocus(this_00);
      attribute = WA_Disabled;
    }
  }
  for (uVar7 = 0; uVar7 < *(ulong *)&this->field_0x28; uVar7 = uVar7 + 1) {
    pQVar5 = *(QWidget **)(*(long *)&this->field_0x20 + uVar7 * 8);
    if (((pQVar5 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0))
       && (bVar3 = QWidget::testAttribute(pQVar5,attribute), !bVar3)) {
      setEnabled_helper(*(QWidgetPrivate **)&pQVar5->field_0x8,enable);
    }
  }
  if (((*(byte *)(*(long *)&this_00->field_0x8 + 0x240) & 0x40) != 0) ||
     (pQVar4 = this_00->data,
     ((pQVar4->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    qt_qpa_set_cursor(this_00,false);
    pQVar4 = this_00->data;
  }
  if (((pQVar4->widget_attributes & 0x4000) != 0) && (bVar3 = QWidget::hasFocus(this_00), bVar3)) {
    pQVar5 = effectiveFocusWidget(this);
    if (enable) {
      if ((pQVar5->data->widget_attributes & 0x4000) == 0) goto LAB_002f5979;
    }
    else {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    uVar6 = QGuiApplication::inputMethod();
    QInputMethod::update(uVar6,1);
  }
LAB_002f5979:
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,EnabledChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
LAB_002f59a7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setEnabled_helper(bool enable)
{
    Q_Q(QWidget);

    if (enable && !q->isWindow() && q->parentWidget() && !q->parentWidget()->isEnabled())
        return; // nothing we can do

    if (enable != q->testAttribute(Qt::WA_Disabled))
        return; // nothing to do

    q->setAttribute(Qt::WA_Disabled, !enable);
    updateSystemBackground();

    if (!enable && q->window()->focusWidget() == q) {
        bool parentIsEnabled = (!q->parentWidget() || q->parentWidget()->isEnabled());
        if (!parentIsEnabled || !q->focusNextChild())
            q->clearFocus();
    }

    Qt::WidgetAttribute attribute = enable ? Qt::WA_ForceDisabled : Qt::WA_Disabled;
    for (int i = 0; i < children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(children.at(i));
        if (w && !w->testAttribute(attribute))
            w->d_func()->setEnabled_helper(enable);
    }
#ifndef QT_NO_CURSOR
    if (q->testAttribute(Qt::WA_SetCursor) || q->isWindow()) {
        // enforce the windows behavior of clearing the cursor on
        // disabled widgets
        qt_qpa_set_cursor(q, false);
    }
#endif
#ifndef QT_NO_IM
    if (q->testAttribute(Qt::WA_InputMethodEnabled) && q->hasFocus()) {
        QWidget *focusWidget = effectiveFocusWidget();

        if (enable) {
            if (focusWidget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        } else {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
    }
#endif //QT_NO_IM
    QEvent e(QEvent::EnabledChange);
    QCoreApplication::sendEvent(q, &e);
}